

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dchClass.c
# Opt level: O2

void Dch_ObjAddClass(Dch_Cla_t *p,Aig_Obj_t *pRepr,Aig_Obj_t **pClass,int nSize)

{
  int iVar1;
  uint __line;
  char *__assertion;
  
  iVar1 = pRepr->Id;
  if (p->pId2Class[iVar1] == (Aig_Obj_t **)0x0) {
    p->pId2Class[iVar1] = pClass;
    if (p->pClassSizes[iVar1] == 0) {
      if (1 < nSize) {
        p->pClassSizes[iVar1] = nSize;
        p->nClasses = p->nClasses + 1;
        p->nLits = p->nLits + nSize + -1;
        return;
      }
      __assertion = "nSize > 1";
      __line = 0x5f;
    }
    else {
      __assertion = "p->pClassSizes[pRepr->Id] == 0";
      __line = 0x5e;
    }
  }
  else {
    __assertion = "p->pId2Class[pRepr->Id] == NULL";
    __line = 0x5c;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/dch/dchClass.c"
                ,__line,"void Dch_ObjAddClass(Dch_Cla_t *, Aig_Obj_t *, Aig_Obj_t **, int)");
}

Assistant:

static inline void Dch_ObjAddClass( Dch_Cla_t * p, Aig_Obj_t * pRepr, Aig_Obj_t ** pClass, int nSize ) 
{
    assert( p->pId2Class[pRepr->Id] == NULL );
    p->pId2Class[pRepr->Id] = pClass; 
    assert( p->pClassSizes[pRepr->Id] == 0 );
    assert( nSize > 1 );
    p->pClassSizes[pRepr->Id] = nSize;
    p->nClasses++;
    p->nLits += nSize - 1;
}